

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

bool __thiscall QGles2RenderBuffer::create(QGles2RenderBuffer *this)

{
  QRhiGles2 *this_00;
  QSize QVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  QOpenGLFunctionsPrivate *pQVar5;
  _func_void_GLenum_GLsizei_GLenum_GLsizei_GLsizei **pp_Var6;
  GLchar *pGVar7;
  Representation RVar8;
  undefined8 uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QRhiResource *copy;
  bool local_39;
  QGles2RenderBuffer *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->renderbuffer != 0) {
    (*(this->super_QRhiRenderBuffer).super_QRhiResource._vptr_QRhiResource[3])(this);
  }
  this_00 = (QRhiGles2 *)(this->super_QRhiRenderBuffer).super_QRhiResource.m_rhi;
  iVar4 = QRhiImplementation::effectiveSampleCount
                    ((QRhiImplementation *)this_00,(this->super_QRhiRenderBuffer).m_sampleCount);
  this->samples = iVar4;
  if (((this->super_QRhiRenderBuffer).m_flags.super_QFlagsStorageHelper<QRhiRenderBuffer::Flag,_4>.
       super_QFlagsStorage<QRhiRenderBuffer::Flag>.i & 1) != 0) {
    bVar13 = true;
    if ((this->super_QRhiRenderBuffer).m_type == DepthStencil) goto LAB_0057d3db;
    create();
  }
  bVar13 = false;
  bVar2 = QRhiGles2::ensureContext(this_00,(QSurface *)0x0);
  if (!bVar2) goto LAB_0057d3db;
  (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
    [0x4e])(1,&this->renderbuffer);
  (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
    [0x34])(0x8d41,(ulong)this->renderbuffer);
  bVar13 = 0 < (this->super_QRhiRenderBuffer).m_pixelSize.wd.m_i;
  bVar2 = 0 < (this->super_QRhiRenderBuffer).m_pixelSize.ht.m_i;
  QVar1 = (this->super_QRhiRenderBuffer).m_pixelSize;
  uVar12 = (ulong)QVar1 >> 0x20;
  if (!bVar2 || !bVar13) {
    uVar12 = 1;
  }
  RVar8.m_i = 1;
  if (bVar2 && bVar13) {
    RVar8.m_i = QVar1.wd.m_i.m_i;
  }
  uVar11 = *(uint *)&(this_00->caps).field_0x38;
  if ((this->super_QRhiRenderBuffer).m_type == DepthStencil) {
    if (((uVar11 & 1) == 0) || (this->samples < 2)) {
      if ((uVar11 & 0x6000) == 0) {
        bVar13 = (uVar11 & 8) != 0;
        uVar10 = 0x1902;
        if (bVar13) {
          uVar10 = (ulong)(((uVar11 >> 0x13 & 1) != 0) + 0x81a5);
        }
        uVar11 = 0x8d48;
        if (!bVar13) {
          uVar11 = 0x1901;
        }
        (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
          functions[0x69])(0x8d41,uVar10,(ulong)(uint)RVar8.m_i,uVar12);
        (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
          functions[0x4e])(1,&this->stencilRenderbuffer);
        (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
          functions[0x34])(0x8d41,(ulong)this->stencilRenderbuffer);
        pQVar5 = (this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr;
        uVar10 = (ulong)uVar11;
        goto LAB_0057d244;
      }
      uVar9 = 0x84f9;
      if ((uVar11 >> 0xe & 1) == 0) {
        uVar9 = 0x88f0;
      }
      (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
        functions[0x69])(0x8d41,uVar9,(ulong)(uint)RVar8.m_i,uVar12);
    }
    else {
      if (((this_00->caps).field_0x3d & 1) == 0) {
        pp_Var6 = (_func_void_GLenum_GLsizei_GLenum_GLsizei_GLsizei **)
                  ((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr[1].field_0
                   .functions + 0x18);
      }
      else {
        pp_Var6 = &this_00->glRenderbufferStorageMultisampleEXT;
      }
      (**pp_Var6)(0x8d41,this->samples,0x88f0,RVar8.m_i,(GLsizei)uVar12);
    }
    this->stencilRenderbuffer = 0;
  }
  else {
    if ((uVar11 >> 0x14 & 1) != 0) {
      uVar3 = (*(code *)(&DAT_006c6418 +
                        *(int *)(&DAT_006c6418 +
                                (ulong)(this->super_QRhiRenderBuffer).m_backingFormatHint * 4)))();
      return (bool)uVar3;
    }
    if (((uVar11 & 1) == 0) || (this->samples < 2)) {
      pQVar5 = (this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr;
      uVar10 = 0x8056;
LAB_0057d244:
      (*(pQVar5->field_0).functions[0x69])(0x8d41,uVar10,(ulong)(uint)RVar8.m_i,uVar12);
    }
    else {
      (*(this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr[1].field_0.functions
        [0x18])(0x8d41,(ulong)(uint)this->samples,0x8056,(ulong)(uint)RVar8.m_i,uVar12);
    }
  }
  if (this_00->glObjectLabel != (_func_void_GLenum_GLuint_GLsizei_GLchar_ptr *)0x0) {
    pGVar7 = (this->super_QRhiRenderBuffer).super_QRhiResource.m_objectName.d.ptr;
    if (pGVar7 == (GLchar *)0x0) {
      pGVar7 = (GLchar *)&QByteArray::_empty;
    }
    (*this_00->glObjectLabel)(0x8d41,this->renderbuffer,-1,pGVar7);
  }
  bVar13 = true;
  this->owns = true;
  this->generation = this->generation + 1;
  local_39 = true;
  local_38 = this;
  QHash<QRhiResource*,bool>::emplace<bool_const&>
            ((QHash<QRhiResource*,bool> *)&(this_00->super_QRhiImplementation).resources,
             (QRhiResource **)&local_38,&local_39);
LAB_0057d3db:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar13;
  }
  __stack_chk_fail();
}

Assistant:

bool QGles2RenderBuffer::create()
{
    if (renderbuffer)
        destroy();

    QRHI_RES_RHI(QRhiGles2);
    samples = rhiD->effectiveSampleCount(m_sampleCount);

    if (m_flags.testFlag(UsedWithSwapChainOnly)) {
        if (m_type == DepthStencil)
            return true;

        qWarning("RenderBuffer: UsedWithSwapChainOnly is meaningless in combination with Color");
    }

    if (!rhiD->ensureContext())
        return false;

    rhiD->f->glGenRenderbuffers(1, &renderbuffer);
    rhiD->f->glBindRenderbuffer(GL_RENDERBUFFER, renderbuffer);

    const QSize size = m_pixelSize.isEmpty() ? QSize(1, 1) : m_pixelSize;

    switch (m_type) {
    case QRhiRenderBuffer::DepthStencil:
        if (rhiD->caps.msaaRenderBuffer && samples > 1) {
            if (rhiD->caps.glesMultisampleRenderToTexture) {
                // Must match the logic in QGles2TextureRenderTarget::create().
                // EXT and non-EXT are not the same thing.
                rhiD->glRenderbufferStorageMultisampleEXT(GL_RENDERBUFFER, samples, GL_DEPTH24_STENCIL8,
                                                          size.width(), size.height());
            } else {
                rhiD->f->glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, GL_DEPTH24_STENCIL8,
                                                          size.width(), size.height());
            }
            stencilRenderbuffer = 0;
        } else if (rhiD->caps.packedDepthStencil || rhiD->caps.needsDepthStencilCombinedAttach) {
            const GLenum storage = rhiD->caps.needsDepthStencilCombinedAttach ? GL_DEPTH_STENCIL : GL_DEPTH24_STENCIL8;
            rhiD->f->glRenderbufferStorage(GL_RENDERBUFFER, storage,
                                           size.width(), size.height());
            stencilRenderbuffer = 0;
        } else {
            GLenum depthStorage = GL_DEPTH_COMPONENT;
            if (rhiD->caps.gles) {
                if (rhiD->caps.depth24)
                    depthStorage = GL_DEPTH_COMPONENT24;
                else
                    depthStorage = GL_DEPTH_COMPONENT16; // plain ES 2.0 only has this
            }
            const GLenum stencilStorage = rhiD->caps.gles ? GL_STENCIL_INDEX8 : GL_STENCIL_INDEX;
            rhiD->f->glRenderbufferStorage(GL_RENDERBUFFER, depthStorage,
                                           size.width(), size.height());
            rhiD->f->glGenRenderbuffers(1, &stencilRenderbuffer);
            rhiD->f->glBindRenderbuffer(GL_RENDERBUFFER, stencilRenderbuffer);
            rhiD->f->glRenderbufferStorage(GL_RENDERBUFFER, stencilStorage,
                                           size.width(), size.height());
        }
        break;
    case QRhiRenderBuffer::Color:
    {
        GLenum internalFormat = GL_RGBA4; // ES 2.0
        if (rhiD->caps.rgba8Format) {
            internalFormat = GL_RGBA8;
            if (m_backingFormatHint != QRhiTexture::UnknownFormat) {
                GLenum glintformat, glformat, gltype;
                // only care about the sized internal format, the rest is not used here
                toGlTextureFormat(m_backingFormatHint, rhiD->caps,
                                  &glintformat, &internalFormat, &glformat, &gltype);
            }
        }
        if (rhiD->caps.msaaRenderBuffer && samples > 1) {
            rhiD->f->glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, internalFormat,
                                                      size.width(), size.height());
        } else {
            rhiD->f->glRenderbufferStorage(GL_RENDERBUFFER, internalFormat,
                                           size.width(), size.height());
        }
    }
        break;
    default:
        Q_UNREACHABLE();
        break;
    }

    if (rhiD->glObjectLabel)
        rhiD->glObjectLabel(GL_RENDERBUFFER, renderbuffer, -1, m_objectName.constData());

    owns = true;
    generation += 1;
    rhiD->registerResource(this);
    return true;
}